

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O1

void to_uint32_array_test(void)

{
  int iVar1;
  run_container_t *run;
  void *vout;
  int k;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = 1;
  do {
    run = run_container_create();
    _assert_true((unsigned_long)run,"B",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                 ,0x83);
    uVar2 = 0;
    do {
      run_container_add(run,(uint16_t)uVar2);
      uVar2 = uVar2 + (int)uVar3;
    } while (uVar2 < 0x10000);
    iVar1 = run_container_cardinality(run);
    vout = malloc((long)iVar1 * 4);
    uVar2 = run_container_to_uint32_array(vout,run,0);
    _assert_int_equal((long)(int)uVar2,(long)iVar1,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                      ,0x8c);
    if (1 < (int)uVar2) {
      uVar4 = 1;
      do {
        _assert_int_equal((ulong)*(uint *)((long)vout + uVar4 * 4),
                          *(uint *)((long)vout + uVar4 * 4 + -4) + uVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                          ,0x8f);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    free(vout);
    run_container_free(run);
    bVar5 = uVar3 < 0x40;
    uVar3 = uVar3 * 2;
  } while (bVar5);
  return;
}

Assistant:

DEFINE_TEST(to_uint32_array_test) {
    for (size_t offset = 1; offset < 128; offset *= 2) {
        run_container_t* B = run_container_create();
        assert_non_null(B);

        for (int k = 0; k < (1 << 16); k += offset) {
            run_container_add(B, k);
        }

        int card = run_container_cardinality(B);
        uint32_t* out = (uint32_t*)malloc(sizeof(uint32_t) * card);
        int nc = run_container_to_uint32_array(out, B, 0);
        assert_int_equal(nc, card);

        for (int k = 1; k < nc; ++k) {
            assert_int_equal(out[k], offset + out[k - 1]);
        }

        free(out);
        run_container_free(B);
    }
}